

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(longlong lhs,
         SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  longlong ret;
  uint local_28;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_24;
  longlong local_20;
  longlong local_18;
  
  local_20 = 0;
  local_28 = rhs.m_int;
  local_18 = lhs;
  DivisionHelper<long_long,unsigned_int,4>::
  DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (&local_18,&local_28,&local_20);
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long_long>(&local_24,&local_20);
  return (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )local_24.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}